

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_float32_suite::test_array64_float32_empty(void)

{
  value *pvVar1;
  value vVar2;
  value_type input [9];
  decoder decoder;
  value local_68 [2];
  uchar local_60 [16];
  decoder local_50;
  
  local_50.input._M_str = local_60;
  local_60[8] = 0;
  local_60[0] = 0xdd;
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
  local_60[4] = '\0';
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  local_50.input._M_len = 9;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_68[0] = local_50.current.code;
  pvVar1 = local_68 + 1;
  local_68[1] = 0xdd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array64_float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xe1b,"void compact_float32_suite::test_array64_float32_empty()",local_68,pvVar1);
  local_68[0] = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_68[1] = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xe1c,"void compact_float32_suite::test_array64_float32_empty()",local_68,pvVar1);
  vVar2 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_68[0] = end;
  if (vVar2 - null < 0xc) {
    local_68[0] = *(value *)(&DAT_00124a00 + (ulong)(vVar2 - null) * 4);
  }
  local_68[1] = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xe1d,"void compact_float32_suite::test_array64_float32_empty()",local_68,pvVar1);
  boost::detail::test_impl
            ("decoder.literal().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xe1e,"void compact_float32_suite::test_array64_float32_empty()",
             local_50.current.view._M_len == 0);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_68[0] = local_50.current.code;
  local_68[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xe20,"void compact_float32_suite::test_array64_float32_empty()",local_68,pvVar1);
  return;
}

Assistant:

void test_array64_float32_empty()
{
    const value_type input[] = { token::code::array64_float32, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array64_float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(decoder.literal().empty());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}